

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.h
# Opt level: O2

void __thiscall cmake::AddCacheEntry(cmake *this,string *key,char *value,char *helpString,int type)

{
  cmValue value_00;
  allocator<char> local_51;
  string local_50;
  
  if (value == (char *)0x0) {
    value_00.Value = (string *)0x0;
  }
  else {
    value_00.Value = &local_50;
    std::__cxx11::string::string<std::allocator<char>>((string *)value_00.Value,value,&local_51);
  }
  AddCacheEntry(this,key,value_00,helpString,type);
  if (value != (char *)0x0) {
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void AddCacheEntry(const std::string& key, const char* value,
                     const char* helpString, int type)
  {
    this->AddCacheEntry(key,
                        value ? cmValue(std::string(value)) : cmValue(nullptr),
                        helpString, type);
  }